

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.h
# Opt level: O2

void __thiscall jaegertracing::thrift::Process::Process(Process *this)

{
  *(undefined **)this = &__cxxabiv1::__si_class_type_info::vtable;
  *(Process **)(this + 8) = this + 0x18;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x18] = (Process)0x0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  this[0x40] = (Process)((byte)this[0x40] & 0xfe);
  return;
}

Assistant:

Process() : serviceName() {
  }